

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_physical_device_features
          (Impl *this,void *device_pnext,ScratchAllocator *alloc,VkPhysicalDeviceFeatures2 **out_pdf
          )

{
  int *piVar1;
  bool bVar2;
  Impl *__dest;
  Impl *this_00;
  VkBaseInStructure *base_in;
  int *__src;
  
  __src = (int *)device_pnext;
  if (device_pnext == (void *)0x0) {
    return false;
  }
  while (*__src != 0x3b9bb078) {
    piVar1 = __src + 2;
    __src = *(int **)piVar1;
    if (*(int **)piVar1 == (int *)0x0) {
      return false;
    }
  }
  this_00 = (Impl *)alloc;
  __dest = (Impl *)ScratchAllocator::allocate_raw(alloc,0xf0,0x10);
  if (__dest != (Impl *)0x0) {
    this_00 = __dest;
    memmove(__dest,__src,0xf0);
  }
  (__dest->temp_allocator).impl = (Impl *)0x0;
  bVar2 = copy_pnext_chain_pdf2(this_00,device_pnext,alloc,&(__dest->temp_allocator).impl);
  if (!bVar2) {
    return false;
  }
  *out_pdf = (VkPhysicalDeviceFeatures2 *)__dest;
  return true;
}

Assistant:

static const T *find_pnext(VkStructureType sType, const void *pNext)
{
	while (pNext)
	{
		auto *base_in = static_cast<const VkBaseInStructure *>(pNext);
		if (base_in->sType == sType)
			return static_cast<const T *>(pNext);
		pNext = base_in->pNext;
	}
	return nullptr;
}